

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbe0;
  double *in_stack_fffffffffffffbe8;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbf0;
  key_equal *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc04;
  float in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  float in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  float fVar3;
  float in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc60;
  float local_394;
  float local_35c;
  float local_354;
  AssertionResult local_2c0 [2];
  key_equal *local_2a0;
  AssertionResult local_298 [3];
  value_type local_25c;
  key_type local_254;
  key_type local_250;
  int local_24c;
  float local_234;
  AssertionResult local_230 [2];
  float local_20c;
  undefined8 local_208;
  AssertionResult local_200;
  float local_1ec;
  size_type local_1d8;
  AssertionResult local_1d0 [2];
  size_type local_1b0;
  AssertionResult local_1a8 [3];
  value_type local_170;
  int local_168;
  key_type local_164;
  value_type local_138;
  size_type local_130;
  float local_114;
  undefined8 local_110;
  AssertionResult local_108 [2];
  float local_e4;
  AssertionResult local_e0;
  key_type local_d0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c0;
  Hasher local_b0;
  Hasher local_a4 [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    Hasher::Hasher(local_a4,0);
    Hasher::Hasher(&local_b0,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c0,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (hasher *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8,(allocator_type *)in_stack_fffffffffffffbf0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c0);
    local_d0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffffbe0,
                      (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    local_e4 = google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::max_load_factor((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xca56b5);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (float *)in_stack_fffffffffffffbe8,(float *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      testing::AssertionResult::failure_message((AssertionResult *)0xca5772);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca57d5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca5846);
    local_110 = 0;
    local_114 = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xca585f);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(float *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      testing::AssertionResult::failure_message((AssertionResult *)0xca58ef);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca5952);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca59c3);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize(in_stack_fffffffffffffbe0,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
            );
    local_130 = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca59e4);
    local_138 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc60,
             (value_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    local_164 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffbf0,
                            (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffbe0,
            (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    local_168 = 2;
    while( true ) {
      local_170 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0)
      ;
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc60,
               (value_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xca5aee);
      local_354 = (float)sVar2;
      local_35c = (float)local_130;
      if (local_14 <= local_354 / local_35c) break;
      local_1b0 = google::
                  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xca5bd9);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (unsigned_long *)in_stack_fffffffffffffbe8,
                 (unsigned_long *)in_stack_fffffffffffffbe0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        testing::AssertionResult::failure_message((AssertionResult *)0xca5c66);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (Type)in_stack_fffffffffffffc0c,
                   (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffc60,
                   (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
        testing::Message::~Message((Message *)0xca5cc9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xca5d34);
      local_168 = local_168 + 1;
    }
    local_1d8 = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca5d58);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (unsigned_long *)in_stack_fffffffffffffbe8,(unsigned_long *)in_stack_fffffffffffffbe0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      testing::AssertionResult::failure_message((AssertionResult *)0xca5dd3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca5e36);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca5ea1);
    sVar2 = google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xca5eda);
    local_394 = (float)sVar2;
    in_stack_fffffffffffffc60 =
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xca5f50);
    in_stack_fffffffffffffc58 = (float)in_stack_fffffffffffffc60;
    local_1ec = local_394 / in_stack_fffffffffffffc58 + -0.01;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8);
    local_208 = 0x3ff0000000000000;
    local_20c = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xca600b);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,(float *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    in_stack_fffffffffffffc5c = local_394;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      testing::AssertionResult::failure_message((AssertionResult *)0xca6083);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(local_394,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca60e0);
      in_stack_fffffffffffffc5c = local_394;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca614e);
    local_234 = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xca615b);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (float *)in_stack_fffffffffffffbe8,(float *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      testing::AssertionResult::failure_message((AssertionResult *)0xca61e5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca6242);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca62b3);
    local_130 = google::
                BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xca62c0);
    local_24c = 2;
    while( true ) {
      local_250 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffbf0,
                              (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffbe0,
              (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_254 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffbf0,
                              (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffbe0,
              (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      local_25c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0)
      ;
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc60,
               (value_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      sVar2 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xca63af);
      in_stack_fffffffffffffc10 = (float)(long)sVar2;
      in_stack_fffffffffffffc04 = (float)sVar2;
      in_stack_fffffffffffffc08 = (float)(long)local_130;
      in_stack_fffffffffffffc0c = (float)local_130;
      if (in_stack_fffffffffffffc04 / in_stack_fffffffffffffc0c <= local_1ec) break;
      fVar3 = in_stack_fffffffffffffc04;
      in_stack_fffffffffffffbf8 =
           (key_equal *)
           google::
           BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)0xca646c);
      local_2a0 = in_stack_fffffffffffffbf8;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
                 (unsigned_long *)in_stack_fffffffffffffbe8,
                 (unsigned_long *)in_stack_fffffffffffffbe0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(fVar3,in_stack_fffffffffffffc10));
        in_stack_fffffffffffffbf0 =
             (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xca64f3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(fVar3,in_stack_fffffffffffffc10),
                   (Type)in_stack_fffffffffffffc0c,
                   (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                   (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffc60,
                   (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
        testing::Message::~Message((Message *)0xca6550);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xca65bb);
      local_24c = local_24c + 1;
    }
    in_stack_fffffffffffffc14 = in_stack_fffffffffffffc04;
    in_stack_fffffffffffffbe8 =
         (double *)
         google::
         BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xca65df);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0,
               (unsigned_long *)in_stack_fffffffffffffbe8,(unsigned_long *)in_stack_fffffffffffffbe0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      in_stack_fffffffffffffbe0 =
           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xca6654);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (Type)in_stack_fffffffffffffc0c,
                 (char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffc60,
                 (Message *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0xca66b1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xca671c);
    google::
    HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xca6752);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}